

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void sat_solver_record(sat_solver *s,veci *cls)

{
  int iVar1;
  int iVar2;
  int *begin_00;
  int local_3c;
  int RetValue;
  int h;
  lit *end;
  lit *begin;
  veci *cls_local;
  sat_solver *s_local;
  
  begin_00 = veci_begin(cls);
  iVar1 = veci_size(cls);
  iVar2 = veci_size(cls);
  if (iVar2 < 2) {
    local_3c = 0;
  }
  else {
    local_3c = sat_solver_clause_new(s,begin_00,begin_00 + iVar1,1);
  }
  sat_solver_enqueue(s,*begin_00,local_3c);
  iVar2 = veci_size(cls);
  if (iVar2 < 1) {
    __assert_fail("veci_size(cls) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.c"
                  ,0x259,"void sat_solver_record(sat_solver *, veci *)");
  }
  if (local_3c == 0) {
    veci_push(&s->unit_lits,*begin_00);
  }
  if ((s->pStore != (void *)0x0) &&
     (iVar1 = Sto_ManAddClause((Sto_Man_t *)s->pStore,begin_00,begin_00 + iVar1), iVar1 == 0)) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.c"
                  ,0x262,"void sat_solver_record(sat_solver *, veci *)");
  }
  return;
}

Assistant:

static void sat_solver_record(sat_solver* s, veci* cls)
{
    lit*    begin = veci_begin(cls);
    lit*    end   = begin + veci_size(cls);
    int     h     = (veci_size(cls) > 1) ? sat_solver_clause_new(s,begin,end,1) : 0;
    sat_solver_enqueue(s,*begin,h);
    assert(veci_size(cls) > 0);
    if ( h == 0 )
        veci_push( &s->unit_lits, *begin );

    ///////////////////////////////////
    // add clause to internal storage
    if ( s->pStore )
    {
        int RetValue = Sto_ManAddClause( (Sto_Man_t *)s->pStore, begin, end );
        assert( RetValue );
        (void) RetValue;
    }
    ///////////////////////////////////
/*
    if (h != 0) {
        act_clause_bump(s,clause_read(s, h));
        s->stats.learnts++;
        s->stats.learnts_literals += veci_size(cls);
    }
*/
}